

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Gia_Man_t * Bmc_CexBuildNetwork(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint local_4c;
  
  local_4c = pCex->nRegs;
  p_00 = Gia_ManStart(1000);
  pcVar9 = (char *)malloc(6);
  builtin_strncpy(pcVar9,"unate",6);
  p_00->pName = pcVar9;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  p->pObjs->Value = 0xffffffff;
  iVar12 = p->nRegs;
  if (0 < iVar12) {
    iVar6 = 0;
    do {
      iVar13 = p->vCos->nSize;
      uVar19 = (iVar13 - iVar12) + iVar6;
      if (((int)uVar19 < 0) || (iVar13 <= (int)uVar19)) goto LAB_00585073;
      iVar12 = p->vCos->pArray[uVar19];
      lVar15 = (long)iVar12;
      if ((lVar15 < 0) || (p->nObjs <= iVar12)) goto LAB_00585035;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar3 + lVar15) =
           *(ulong *)(pGVar3 + lVar15) & 0xbfffffffbfffffff | 0x4000000000000000;
      pGVar3[lVar15].Value = 0xffffffff;
      iVar6 = iVar6 + 1;
      iVar12 = p->nRegs;
    } while (iVar6 < iVar12);
  }
  Gia_ManHashAlloc(p_00);
  if (-1 < pCex->iFrame) {
    iVar12 = 0;
    do {
      iVar6 = p->nRegs;
      pVVar16 = p->vCis;
      iVar13 = pVVar16->nSize;
      if (iVar6 < iVar13) {
        lVar15 = 0;
        do {
          if (iVar13 <= lVar15) goto LAB_00585073;
          iVar13 = pVVar16->pArray[lVar15];
          if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_00585035;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar13;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xbfffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)(lVar15 + (ulong)local_4c) >> 5] >>
                        ((byte)(lVar15 + (ulong)local_4c) & 0x1f) & 1) << 0x1e);
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar23 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar23 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar23 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_00585054:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00585054;
          pGVar3->Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
          lVar15 = lVar15 + 1;
          iVar6 = p->nRegs;
          pVVar16 = p->vCis;
          iVar13 = pVVar16->nSize;
        } while (lVar15 < iVar13 - iVar6);
        local_4c = local_4c + (int)lVar15;
      }
      if (0 < iVar6) {
        iVar13 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar19 = (iVar1 - iVar6) + iVar13;
          if (((int)uVar19 < 0) || (iVar1 <= (int)uVar19)) goto LAB_00585073;
          iVar1 = p->vCos->pArray[uVar19];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00585035;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar19 = (iVar2 - iVar6) + iVar13;
          if (((int)uVar19 < 0) || (iVar2 <= (int)uVar19)) goto LAB_00585073;
          uVar19 = p->vCis->pArray[uVar19];
          lVar15 = (long)(int)uVar19;
          if ((lVar15 < 0) || ((uint)p->nObjs <= uVar19)) goto LAB_00585035;
          pGVar4 = pGVar3 + iVar1;
          uVar23 = *(ulong *)pGVar4;
          uVar24 = *(ulong *)(pGVar3 + lVar15);
          *(ulong *)(pGVar3 + lVar15) = uVar24 & 0xffffffffbfffffff | uVar23 & 0x40000000;
          *(ulong *)(pGVar3 + lVar15) =
               uVar24 & 0xbfffffffbfffffff | uVar23 & 0x40000000 |
               *(ulong *)pGVar4 & 0x4000000000000000;
          pGVar3[lVar15].Value = pGVar4->Value;
          iVar13 = iVar13 + 1;
          iVar6 = p->nRegs;
        } while (iVar13 < iVar6);
      }
      if (0 < p->nObjs) {
        lVar15 = 0;
        lVar25 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar23 = *(ulong *)(&pGVar3->field_0x0 + lVar15);
          if ((uVar23 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar23) {
            uVar7 = (int)(uVar23 & 0x1fffffff) << 2;
            uVar22 = *(uint *)((long)pGVar3 + lVar15 + (ulong)uVar7 * -3) >> 0x1e;
            uVar8 = uVar22 & 1;
            uVar19 = (uint)(uVar23 >> 0x1d);
            uVar14 = uVar19 & 1;
            uVar17 = (uint)(uVar23 >> 0x1e) & 0x7ffffffc;
            uVar18 = *(uint *)((long)pGVar3 + lVar15 + (ulong)uVar17 * -3) >> 0x1e & 1;
            uVar20 = (uint)(uVar23 >> 0x3d) & 1;
            uVar19 = (uVar18 ^ uVar20) & (uVar22 ^ uVar19 & 7);
            uVar24 = (ulong)(uVar19 << 0x1e);
            *(ulong *)(&pGVar3->field_0x0 + lVar15) = uVar23 & 0xffffffff3fffffff | uVar24;
            if (uVar19 == 0) {
              if ((uVar8 == uVar14) && (uVar18 == uVar20)) {
                uVar24 = *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar17 * -3) |
                         *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar7 * -3);
              }
              else if (uVar8 == uVar14) {
                uVar24 = *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar7 * -3);
              }
              else {
                if (uVar18 != uVar20) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                ,0xf6,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
                }
                uVar24 = *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar17 * -3);
              }
              uVar23 = uVar23 & 0xbfffffff3fffffff | uVar24 & 0x4000000000000000;
            }
            else {
              uVar23 = uVar23 & 0xbfffffff3fffffff | uVar24 |
                       *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar7 * -3) & 0x4000000000000000 &
                       *(ulong *)((long)pGVar3 + lVar15 + (ulong)uVar17 * -3);
            }
            *(ulong *)(&pGVar3->field_0x0 + lVar15) = uVar23;
            *(undefined4 *)((long)&pGVar3->Value + lVar15) = 0xffffffff;
            if ((uVar23 & 0x4000000000000000) == 0) {
              uVar19 = (uint)uVar23;
              if (uVar19 >> 0x1e == 0) {
                if ((uVar8 == uVar14) && (uVar18 == uVar20)) {
                  iVar6 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                     lVar15 + 8 +
                                                     (ulong)((uVar19 & 0x1fffffff) << 2) * -3),
                                        *(int *)((long)pGVar3 +
                                                lVar15 + 8 +
                                                (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3));
                }
                else {
                  if (uVar8 == uVar14) {
                    uVar19 = (uVar19 & 0x1fffffff) << 2;
                  }
                  else {
                    if (uVar18 != uVar20) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                    ,0x102,
                                    "Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
                    }
                    uVar19 = (uint)(uVar23 >> 0x1e) & 0x7ffffffc;
                  }
                  iVar6 = *(int *)((long)pGVar3 + lVar15 + (ulong)uVar19 * -3 + 8);
                }
              }
              else {
                iVar6 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                    lVar15 + 8 +
                                                    (ulong)((uVar19 & 0x1fffffff) << 2) * -3),
                                       *(int *)((long)pGVar3 +
                                               lVar15 + 8 +
                                               (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3));
              }
              *(int *)((long)&pGVar3->Value + lVar15) = iVar6;
              if (iVar6 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,0x103,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
              }
            }
          }
          lVar25 = lVar25 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar25 < p->nObjs);
      }
      pVVar16 = p->vCos;
      if (0 < pVVar16->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar16->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00585035;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar6;
          uVar23 = *(ulong *)pGVar3;
          uVar24 = (ulong)((uint)uVar23 & 0x1fffffff);
          uVar21 = (ulong)(((uint)uVar23 * 2 ^ *(uint *)(pGVar3 + -uVar24)) & 0x40000000);
          *(ulong *)pGVar3 = uVar23 & 0xffffffffbfffffff | uVar21;
          *(ulong *)pGVar3 =
               uVar23 & 0xbfffffffbfffffff | uVar21 |
               *(ulong *)(pGVar3 + -uVar24) & 0x4000000000000000;
          pGVar3->Value = pGVar3[-uVar24].Value;
          lVar15 = lVar15 + 1;
          pVVar16 = p->vCos;
        } while (lVar15 < pVVar16->nSize);
      }
      bVar5 = iVar12 < pCex->iFrame;
      iVar12 = iVar12 + 1;
    } while (bVar5);
  }
  Gia_ManHashStop(p_00);
  if (local_4c != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x10e,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar19 = pCex->iPo;
  iVar12 = p->vCos->nSize;
  if (iVar12 - p->nRegs <= (int)uVar19) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar19) && ((int)uVar19 < iVar12)) {
    iVar12 = p->vCos->pArray[uVar19];
    lVar15 = (long)iVar12;
    if ((-1 < lVar15) && (iVar12 < p->nObjs)) {
      uVar23 = *(ulong *)(p->pObjs + lVar15);
      if (((uint)uVar23 >> 0x1e & 1) == 0) {
        __assert_fail("pObj->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x111,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      if ((uVar23 & 0x4000000000000000) == 0) {
        uVar19 = p->pObjs[lVar15].Value;
        if (uVar19 != 0) {
          Gia_ManAppendCo(p_00,uVar19);
          pGVar11 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          return pGVar11;
        }
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x113,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      __assert_fail("pObj->fMark1 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                    ,0x112,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
    }
LAB_00585035:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00585073:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = pCex->nRegs;
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = 0;
        pObj->fMark1 = 1;
        pObj->Value  = ~0;
    }
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 0;
            pObj->Value  = Gia_ManAppendCi(pNew);
        }
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}